

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Engine.cpp
# Opt level: O2

void __thiscall
adios2::Engine::Put(Engine *this,VariableNT *variable,complex<double> *datum,Mode launch)

{
  Engine *pointer;
  VariableBase *pointer_00;
  allocator local_69;
  string local_68;
  string local_48;
  
  pointer = this->m_Engine;
  std::__cxx11::string::string((string *)&local_48,"in call to Engine::Put",&local_69);
  helper::CheckForNullptr<adios2::core::Engine>(pointer,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  pointer_00 = variable->m_Variable;
  std::__cxx11::string::string((string *)&local_68,"for variable in call to Engine::Put",&local_69);
  helper::CheckForNullptr<adios2::core::VariableBase>(pointer_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  adios2::core::Engine::Put<std::complex<double>>
            ((Variable *)this->m_Engine,(complex *)variable->m_Variable,(Mode)datum);
  return;
}

Assistant:

void Engine::Get(VariableNT &variable, void *data, const Mode launch)
{
    adios2::helper::CheckForNullptr(m_Engine, "in call to Engine::Get");
    adios2::helper::CheckForNullptr(variable.m_Variable, "for variable in call to Engine::Get");
#define declare_type(T)                                                                            \
    if (variable.m_Variable->m_Type == helper::GetDataType<T>())                                   \
    {                                                                                              \
        m_Engine->Get(*reinterpret_cast<core::Variable<T> *>(variable.m_Variable),                 \
                      reinterpret_cast<T *>(data), launch);                                        \
    }
    ADIOS2_FOREACH_STDTYPE_1ARG(declare_type)
#undef declare_type
    else if (variable.m_Variable->m_Type == DataType::Struct)
    {
        m_Engine->Get(*reinterpret_cast<core::VariableStruct *>(variable.m_Variable), data, launch);
    }
}